

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_avx2.cpp
# Opt level: O0

__m256i * sha256d64_avx2::anon_unknown_0::Read8(uchar *chunk,int offset)

{
  __m256i *palVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  long in_FS_OFFSET;
  __m256i ret;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  palVar1 = *(__m256i **)(in_FS_OFFSET + 0x28);
  uVar7 = ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  uVar8 = ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  uVar9 = ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffe8c,uVar8));
  uVar10 = ReadLE32((uchar *)CONCAT44(uVar9,uVar8));
  uVar11 = ReadLE32((uchar *)CONCAT44(uVar9,uVar8));
  uVar12 = ReadLE32((uchar *)CONCAT44(uVar9,uVar8));
  uVar13 = ReadLE32((uchar *)CONCAT44(uVar9,uVar8));
  uVar14 = ReadLE32((uchar *)CONCAT44(uVar9,uVar8));
  auVar2 = vpinsrd_avx(ZEXT416(uVar14),uVar13,1);
  auVar2 = vpinsrd_avx(auVar2,uVar12,2);
  auVar2 = vpinsrd_avx(auVar2,uVar11,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar10),uVar9,1);
  auVar3 = vpinsrd_avx(auVar3,uVar8,2);
  auVar3 = vpinsrd_avx(auVar3,uVar7,3);
  uStack_b0 = auVar3._0_8_;
  uStack_a8 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0x10203),0x4050607,1);
  auVar3 = vpinsrd_avx(auVar3,0x8090a0b,2);
  auVar3 = vpinsrd_avx(auVar3,0xc0d0e0f,3);
  auVar4 = vpinsrd_avx(ZEXT416(0x10203),0x4050607,1);
  auVar4 = vpinsrd_avx(auVar4,0x8090a0b,2);
  auVar4 = vpinsrd_avx(auVar4,0xc0d0e0f,3);
  uStack_f0 = auVar4._0_8_;
  uStack_e8 = auVar4._8_8_;
  auVar6._16_8_ = uStack_b0;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_a8;
  auVar5._16_8_ = uStack_f0;
  auVar5._0_16_ = auVar3;
  auVar5._24_8_ = uStack_e8;
  vpshufb_avx2(auVar6,auVar5);
  if (*(__m256i **)(in_FS_OFFSET + 0x28) == palVar1) {
    return *(__m256i **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

__m256i inline Read8(const unsigned char* chunk, int offset) {
    __m256i ret = _mm256_set_epi32(
        ReadLE32(chunk + 0 + offset),
        ReadLE32(chunk + 64 + offset),
        ReadLE32(chunk + 128 + offset),
        ReadLE32(chunk + 192 + offset),
        ReadLE32(chunk + 256 + offset),
        ReadLE32(chunk + 320 + offset),
        ReadLE32(chunk + 384 + offset),
        ReadLE32(chunk + 448 + offset)
    );
    return _mm256_shuffle_epi8(ret, _mm256_set_epi32(0x0C0D0E0FUL, 0x08090A0BUL, 0x04050607UL, 0x00010203UL, 0x0C0D0E0FUL, 0x08090A0BUL, 0x04050607UL, 0x00010203UL));
}